

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ushort uVar1;
  void *pvVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  BYTE *pBVar9;
  long lVar10;
  ulong uVar11;
  BYTE *ip [4];
  BYTE *op [4];
  U64 bits [4];
  BYTE *local_98 [4];
  BYTE *local_78 [4];
  U64 local_58 [4];
  U64 *local_38;
  
  pvVar2 = args->dt;
  pBVar3 = args->oend;
  pBVar4 = args->ilimit;
  local_38 = args->bits;
  local_58[2] = args->bits[2];
  local_58[3] = args->bits[3];
  local_58[0] = args->bits[0];
  local_58[1] = args->bits[1];
  local_98[0] = args->ip[0];
  local_98[1] = args->ip[1];
  local_98[2] = args->ip[2];
  local_98[3] = args->ip[3];
  local_78[0] = args->op[0];
  local_78[1] = args->op[1];
  local_78[2] = args->op[2];
  local_78[3] = args->op[3];
  lVar7 = 0;
  while( true ) {
    do {
      pBVar9 = pBVar3;
      if (lVar7 != 3) {
        pBVar9 = local_78[lVar7 + 1];
      }
      if (pBVar9 < local_78[lVar7]) {
        __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8eff,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (local_98[lVar7] < pBVar4) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f00,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    uVar11 = (ulong)((long)pBVar3 - (long)local_78[3]) / 5;
    uVar8 = (ulong)((long)local_98[0] - (long)pBVar4) / 7;
    if (uVar11 < uVar8) {
      uVar8 = uVar11;
    }
    if (((((long)(uVar8 * 5) < 0x14) || (local_98[1] < local_98[0])) || (local_98[2] < local_98[1]))
       || (local_98[3] < local_98[2])) break;
    if (((local_98[1] < local_98[0]) || (local_98[2] < local_98[1])) || (local_98[3] < local_98[2]))
    {
      __assert_fail("ip[stream] >= ip[stream - 1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f25,
                    "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                   );
    }
    pBVar9 = local_78[3] + uVar8 * 5;
    lVar10 = 0;
    do {
      do {
        lVar7 = 0;
        do {
          uVar1 = *(ushort *)((long)pvVar2 + (local_58[lVar7] >> 0x35) * 2);
          local_58[lVar7] = local_58[lVar7] << ((ulong)uVar1 & 0x3f);
          local_78[lVar7][lVar10] = (BYTE)(uVar1 >> 8);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
      lVar7 = 0;
      do {
        uVar6 = 0;
        for (uVar8 = local_58[lVar7]; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
          uVar6 = uVar6 + 1;
        }
        local_78[lVar7] = local_78[lVar7] + 5;
        pBVar5 = local_98[lVar7];
        local_98[lVar7] = pBVar5 + -(ulong)(uVar6 >> 3);
        local_58[lVar7] = (*(ulong *)(pBVar5 + -(ulong)(uVar6 >> 3)) | 1) << ((byte)uVar6 & 7);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar7 = 0;
      lVar10 = 0;
    } while (local_78[3] < pBVar9);
  }
  args->bits[2] = local_58[2];
  args->bits[3] = local_58[3];
  *local_38 = local_58[0];
  args->bits[1] = local_58[1];
  args->ip[2] = local_98[2];
  args->ip[3] = local_98[3];
  args->ip[0] = local_98[0];
  args->ip[1] = local_98[1];
  args->op[2] = local_78[2];
  args->op[3] = local_78[3];
  args->op[0] = local_78[0];
  args->op[1] = local_78[1];
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilimit) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we get close to the end. */
            if (op[3] + 20 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Decode 5 symbols in each of the 4 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 4; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    int const entry = (int)dtable[index];
                    bits[stream] <<= (entry & 63);
                    op[stream][symbol] = (BYTE)((entry >> 8) & 0xFF);
                }
            }
            /* Reload the bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                int const nbBits = ctz & 7;
                int const nbBytes = ctz >> 3;
                op[stream] += 5;
                ip[stream] -= nbBytes;
                bits[stream] = MEM_read64(ip[stream]) | 1;
                bits[stream] <<= nbBits;
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}